

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyPressed(ImGuiKey key,bool repeat)

{
  float fVar1;
  float repeat_delay;
  bool bVar2;
  int iVar3;
  ImGuiContext *g;
  
  iVar3 = key;
  if (((uint)key < 0x200) && (iVar3 = (GImGui->IO).KeyMap[(uint)key], iVar3 == -1)) {
    iVar3 = key;
  }
  fVar1 = (GImGui->IO).KeysData[iVar3].DownDuration;
  bVar2 = fVar1 == 0.0;
  if (repeat && !bVar2) {
    repeat_delay = (GImGui->IO).KeyRepeatDelay;
    if (fVar1 <= repeat_delay) {
      return false;
    }
    iVar3 = GetKeyPressedAmount(key,repeat_delay,(GImGui->IO).KeyRepeatRate);
    bVar2 = 0 < iVar3;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, bool repeat)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(key, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}